

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_x86_64.cpp
# Opt level: O0

void __thiscall hdc::Generator_x86_64::emit(Generator_x86_64 *this,TAC *tac)

{
  ostream *poVar1;
  reference pvVar2;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  TAC *local_18;
  TAC *tac_local;
  Generator_x86_64 *this_local;
  
  local_18 = tac;
  tac_local = (TAC *)this;
  switch(tac->kind) {
  case 0:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,".");
    poVar1 = std::operator<<(poVar1,(string *)&local_18->label);
    std::operator<<(poVar1,":");
    break;
  default:
    std::operator<<((ostream *)&this->field_0x10,"x86_64 gen ERROR: undefined tac");
    break;
  case 3:
    this->regCounter = -1;
    break;
  case 9:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    movl ");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->regs_s,(long)this->regCounter);
    poVar1 = std::operator<<(poVar1,(string *)pvVar2);
    std::operator<<(poVar1,", %ecx\n");
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    sall %cl, ");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->regs_s,(long)(this->regCounter + -1));
    std::operator<<(poVar1,(string *)pvVar2);
    this->regCounter = this->regCounter + -1;
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"andl",&local_39);
    emitInstruction(this,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this->regCounter = this->regCounter + -1;
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"xorl",&local_71);
    emitInstruction(this,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this->regCounter = this->regCounter + -1;
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"orl",&local_99);
    emitInstruction(this,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    this->regCounter = this->regCounter + -1;
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"addl",&local_c1);
    emitInstruction(this,(string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    this->regCounter = this->regCounter + -1;
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"subl",&local_e9);
    emitInstruction(this,(string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    this->regCounter = this->regCounter + -1;
    break;
  case 0xf:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    cmpl $0, ");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->regs_s,(long)this->regCounter);
    std::operator<<(poVar1,(string *)pvVar2);
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"\n    je .");
    std::operator<<(poVar1,(string *)&local_18->label);
    break;
  case 0x10:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    jmp .");
    std::operator<<(poVar1,(string *)&local_18->label);
    break;
  case 0x11:
    this->regCounter = this->regCounter + 1;
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    mov $");
    poVar1 = std::operator<<(poVar1,(string *)&local_18->label);
    poVar1 = std::operator<<(poVar1,", ");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->regs_s,(long)this->regCounter);
    std::operator<<(poVar1,(string *)pvVar2);
  }
  std::operator<<((ostream *)&this->field_0x10,'\n');
  return;
}

Assistant:

void hdc::Generator_x86_64::emit(TAC& tac) {
    switch (tac.kind) {
    case TAC_LABEL:
        output << "." << tac.label << ":";
        break;

    case TAC_END_EXPR:
        regCounter = -1;
        break;

    case TAC_SLL:
        output << "    movl " << regs_s[regCounter] <<", %ecx\n";
        output << "    sall %cl, " << regs_s[regCounter - 1];
        --regCounter;
        break;

    case TAC_BITWISE_AND:
        emitInstruction("andl");
        --regCounter;
        break;

    case TAC_BITWISE_XOR:
        emitInstruction("xorl");
        --regCounter;
        break;

    case TAC_BITWISE_OR:
        emitInstruction("orl");
        --regCounter;
        break;

    case TAC_ADD:
        emitInstruction("addl");
        --regCounter;
        break;

    case TAC_SUB:
        emitInstruction("subl");
        --regCounter;
        break;

    case TAC_IFZ:
        output << "    cmpl $0, " << regs_s[regCounter];
        output << "\n    je ." << tac.label;
        break;

    case TAC_GOTO:
        output << "    jmp ." << tac.label;
        break;

    case TAC_CONST_I32:
        ++regCounter;
        output << "    mov $" << tac.label << ", " << regs_s[regCounter];
        break;

    default:
        output << "x86_64 gen ERROR: undefined tac";
        break;
    }

    output << '\n';
}